

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O3

ssize_t dlep_session_process_buffer(dlep_session *session,void *buffer,size_t length,_Bool is_udp)

{
  ssize_t sVar1;
  ulong uVar2;
  
  if ((log_global_mask[session->log_source] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,session->log_source,"src/generic/dlep/dlep_session.c",0x155,
             (void *)0x0,0,"Processing buffer of %zu bytes",length);
  }
  if (length == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      if ((log_global_mask[session->log_source] & 1) != 0) {
        oonf_log(LOG_SEVERITY_DEBUG,session->log_source,"src/generic/dlep/dlep_session.c",0x15a,
                 (void *)0x0,0,"Processing message at offset %zd",uVar2);
      }
      sVar1 = dlep_session_process_signal(session,(void *)((long)buffer + uVar2),length,is_udp);
      if (sVar1 < 1) {
        return uVar2 | -(ulong)(sVar1 != 0);
      }
      if (session->restrict_signal == DLEP_KILL_SESSION) {
        return uVar2;
      }
      uVar2 = uVar2 + sVar1;
      length = length - sVar1;
    } while (length != 0);
  }
  return uVar2;
}

Assistant:

ssize_t
dlep_session_process_buffer(struct dlep_session *session, const void *buffer, size_t length, bool is_udp) {
  ssize_t result, offset;
  const char *ptr;

  offset = 0;
  ptr = buffer;

  OONF_DEBUG(session->log_source,
    "Processing buffer of"
    " %" PRINTF_SIZE_T_SPECIFIER " bytes",
    length);
  while (length > 0) {
    OONF_DEBUG(session->log_source,
      "Processing message at offset"
      " %" PRINTF_SSIZE_T_SPECIFIER,
      offset);

    if ((result = dlep_session_process_signal(session, &ptr[offset], length, is_udp)) <= 0) {
      if (result < 0) {
        return result;
      }
      break;
    }

    if (session->restrict_signal == DLEP_KILL_SESSION) {
      return offset;
    }
    length -= result;
    offset += result;
  }
  return offset;
}